

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O1

void __thiscall reader_url_suite::test_path_absolute_one::test_method(test_path_absolute_one *this)

{
  bool bVar1;
  int iVar2;
  view_type local_26c;
  uint local_25c;
  uint *local_258;
  undefined **local_250;
  undefined1 local_248;
  undefined8 *local_240;
  uint **local_238;
  view_type local_230;
  undefined8 *local_220;
  undefined1 *local_218;
  undefined **local_210;
  undefined1 local_208;
  undefined8 *local_200;
  char *local_1f8;
  undefined1 local_1f0 [8];
  undefined8 local_1e8;
  shared_count sStack_1e0;
  char *local_1d8;
  char *local_1d0;
  url reader;
  char input [13];
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_230.ptr_ = input;
  builtin_strncpy(input + 8,"path",5);
  builtin_strncpy(input,"scheme:/",8);
  local_230.len_ = strlen(local_230.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_230);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xa0);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  local_26c._4_8_ = &local_26c;
  local_26c.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_258 = &local_25c;
  local_1f0[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_25c = 2;
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_248 = 0;
  local_238 = &local_258;
  local_250 = &PTR__lazy_ostream_00186618;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0xa1);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    iVar2 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"scheme",6
                );
    local_1f0[0] = iVar2 == 0;
  }
  else {
    local_1f0[0] = false;
  }
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_258 = (uint *)0x16fe2f;
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_00186358;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_26c._4_8_ = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_238 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (local_1f0,&local_210,&local_1d8,0xa1,2,2,2,"reader.literal()",&local_230,"\"scheme\"",
             &local_250);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0xa2);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  local_1f0[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_26c.ptr_._0_4_ = CONCAT31(local_26c.ptr_._1_3_,local_1f0[0]);
  local_25c = CONCAT31(local_25c._1_3_,1);
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_26c._4_8_ = &local_26c;
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_001865d8;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_25c;
  local_238 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (local_1f0,&local_210,&local_1d8,0xa2,2,2,2,"reader.next()",&local_230,"true",&local_250
            );
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xa3);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  local_26c.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::category
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_25c = 3;
  local_1f0[0] = (value)local_26c.ptr_ == path;
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_26c._4_8_ = &local_26c;
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_00186518;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_25c;
  local_238 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (local_1f0,&local_210,&local_1d8,0xa3,2,2,2,"reader.category()",&local_230,
             "url::token::category::path",&local_250);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0xa4);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  local_26c.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_25c = 6;
  local_1f0[0] = (value)local_26c.ptr_ == path_segment;
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_26c._4_8_ = &local_26c;
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_00186558;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_25c;
  local_238 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (local_1f0,&local_210,&local_1d8,0xa4,2,2,2,"reader.code()",&local_230,
             "url::token::code::path_segment",&local_250);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0xa5);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  local_1f0[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_26c.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_25c = 8;
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_26c._4_8_ = &local_26c;
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_00186618;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_258 = &local_25c;
  local_238 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (local_1f0,&local_210,&local_1d8,0xa5,2,2,2,"reader.subcode()",&local_230,
             "url::token::subcode::path_segment",&local_250);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0xa6);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    iVar2 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"path",4);
    local_1f0[0] = iVar2 == 0;
  }
  else {
    local_1f0[0] = false;
  }
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_26c._4_8_ = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_258 = (uint *)0x16ffdb;
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_00186698;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_258;
  boost::test_tools::tt_detail::report_assertion
            (local_1f0,&local_210,&local_1d8,0xa6,2,2,2,"reader.literal()",&local_230,"\"path\"",
             &local_250);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_118 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0xa7);
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00186260;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_26c.ptr_._0_4_ = CONCAT31(local_26c.ptr_._1_3_,bVar1);
  local_25c = local_25c & 0xffffff00;
  local_1f0[0] = !bVar1;
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_230.len_ = local_230.len_ & 0xffffffffffffff00;
  local_230.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_218 = (undefined1 *)((long)&local_26c.ptr_ + 4);
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_001865d8;
  local_240 = &boost::unit_test::lazy_ostream::inst;
  local_238 = &local_258;
  local_26c._4_8_ = &local_26c;
  local_258 = &local_25c;
  boost::test_tools::tt_detail::report_assertion
            (local_1f0,&local_210,&local_1d8,0xa7,2,2,2,"reader.next()",&local_230,"false",
             &local_250);
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_absolute_one)
{
    const char input[] = "scheme:/path";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}